

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

Vec_Str_t * Vec_StrAllocArray(char *pArray,int nSize)

{
  Vec_Str_t *pVVar1;
  Vec_Str_t *p;
  int nSize_local;
  char *pArray_local;
  
  pVVar1 = (Vec_Str_t *)malloc(0x10);
  pVVar1->nSize = nSize;
  pVVar1->nCap = nSize;
  pVVar1->pArray = pArray;
  return pVVar1;
}

Assistant:

static inline Vec_Str_t * Vec_StrAllocArray( char * pArray, int nSize )
{
    Vec_Str_t * p;
    p = ABC_ALLOC( Vec_Str_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = pArray;
    return p;
}